

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMBICState.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::COMBICState::Decode(COMBICState *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x3f < KVar1) {
    KDataStream::Read<unsigned_int>(stream,&(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
    KDataStream::Read<unsigned_short>(stream,&(this->super_EnvironmentRecord).m_ui16Length);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Index);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Padding);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32TSC);
    (*(this->m_MunSrc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_MunSrc,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32NumSrcs);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16GeometryIndex);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32SrcType);
    KDataStream::Read<float>(stream,(float *)&this->m_f32BarrageRate);
    KDataStream::Read<float>(stream,(float *)&this->m_f32BarrageDuration);
    KDataStream::Read<float>(stream,(float *)&this->m_f32BarrageCrosswindLength);
    KDataStream::Read<float>(stream,(float *)&this->m_f32BarrageDownwindLength);
    (*(this->m_DetVel).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_DetVel,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void COMBICState::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < COMBIC_STATE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> m_ui32TSC
           >> KDIS_STREAM m_MunSrc
           >> m_ui32NumSrcs
           >> m_ui16GeometryIndex
           >> m_ui16Padding
           >> m_ui32SrcType
           >> m_f32BarrageRate
           >> m_f32BarrageDuration
           >> m_f32BarrageCrosswindLength
           >> m_f32BarrageDownwindLength
           >> KDIS_STREAM m_DetVel
           >> m_ui32Padding;
}